

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# M680XDisassembler.c
# Opt level: O2

void M680X_reg_access(cs_insn *insn,uint16_t *regs_read,uint8_t *regs_read_count,
                     uint16_t *regs_write,uint8_t *regs_write_count)

{
  if (insn->detail != (cs_detail *)0x0) {
    *regs_read_count = insn->detail->regs_read_count;
    *regs_write_count = insn->detail->regs_write_count;
    memcpy(regs_read,insn->detail,(ulong)((uint)*regs_read_count * 2));
    memcpy(regs_write,insn->detail->regs_write,(ulong)((uint)*regs_write_count * 2));
    return;
  }
  *regs_read_count = '\0';
  *regs_write_count = '\0';
  return;
}

Assistant:

void M680X_reg_access(const cs_insn *insn,
	cs_regs regs_read, uint8_t *regs_read_count,
	cs_regs regs_write, uint8_t *regs_write_count)
{
	if (insn->detail == NULL) {
		*regs_read_count = 0;
		*regs_write_count = 0;
	}
	else {
		*regs_read_count = insn->detail->regs_read_count;
		*regs_write_count = insn->detail->regs_write_count;

		memcpy(regs_read, insn->detail->regs_read,
			*regs_read_count * sizeof(insn->detail->regs_read[0]));
		memcpy(regs_write, insn->detail->regs_write,
			*regs_write_count *
			sizeof(insn->detail->regs_write[0]));
	}
}